

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::initialiseSolve(HEkkPrimal *this)

{
  int iVar1;
  long *in_RDI;
  HEkkPrimal *unaff_retaddr;
  HighsInt edge_weight_strategy;
  HEkkPrimal *in_stack_000000f0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  long *__new_size;
  
  in_RDI[5] = *(long *)(*(long *)(*in_RDI + 8) + 0x118);
  in_RDI[6] = *(long *)(*(long *)(*in_RDI + 8) + 0x120);
  in_RDI[7] = *(long *)(*(long *)(*in_RDI + 8) + 0x148);
  *(undefined1 *)(*in_RDI + 0x255c) = 0;
  *(undefined1 *)(*in_RDI + 0x255b) = 0;
  *(undefined4 *)(*in_RDI + 0x2970) = 0;
  *(undefined1 *)(*in_RDI + 0x3708) = 0;
  *(undefined1 *)(*in_RDI + 0x3709) = 0;
  *(undefined4 *)(*in_RDI + 0x370c) = 1;
  *(undefined4 *)(in_RDI + 8) = 0;
  if ((*(byte *)(*in_RDI + 0x2557) & 1) == 0) {
    __new_size = in_RDI;
    std::vector<double,_std::allocator<double>_>::assign
              (in_stack_ffffffffffffffe0,(size_type)in_RDI,(value_type_conflict1 *)0x7a680d);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)unaff_retaddr,(size_type)__new_size);
  }
  iVar1 = *(int *)(*(long *)(*in_RDI + 8) + 0x174);
  if ((iVar1 == -1) || (iVar1 == 1)) {
    *(undefined4 *)(in_RDI + 4) = 1;
  }
  else if (iVar1 == 0) {
    *(undefined4 *)(in_RDI + 4) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 4) = 2;
  }
  if ((int)in_RDI[4] == 0) {
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)0x3ff0000000000000,(size_type)in_RDI,
               (value_type_conflict1 *)0x7a68a9);
  }
  else if ((int)in_RDI[4] == 1) {
    initialiseDevexFramework(unaff_retaddr);
  }
  else if ((int)in_RDI[4] == 2) {
    computePrimalSteepestEdgeWeights(in_stack_000000f0);
  }
  return;
}

Assistant:

void HEkkPrimal::initialiseSolve() {
  // Copy values of simplex solver options to dual simplex options
  primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  dual_feasibility_tolerance =
      ekk_instance_.options_->dual_feasibility_tolerance;
  objective_target = ekk_instance_.options_->objective_target;

  ekk_instance_.status_.has_primal_objective_value = false;
  ekk_instance_.status_.has_dual_objective_value = false;

  ekk_instance_.model_status_ = HighsModelStatus::kNotset;
  ekk_instance_.solve_bailout_ = false;
  ekk_instance_.called_return_from_solve_ = false;
  ekk_instance_.exit_algorithm_ = SimplexAlgorithm::kPrimal;

  rebuild_reason = kRebuildReasonNo;
  if (!ekk_instance_.status_.has_dual_steepest_edge_weights) {
    // No dual weights to maintain, so ensure that the vectors are
    // assigned since they are used around factorization and when
    // setting up the backtracking information. ToDo Eliminate this
    // opacity
    ekk_instance_.dual_edge_weight_.assign(num_row, 1.0);
    ekk_instance_.scattered_dual_edge_weight_.resize(num_tot);
  }
  const HighsInt edge_weight_strategy =
      ekk_instance_.options_->simplex_primal_edge_weight_strategy;
  if (edge_weight_strategy == kSimplexEdgeWeightStrategyChoose ||
      edge_weight_strategy == kSimplexEdgeWeightStrategyDevex) {
    // By default, use Devex
    edge_weight_mode = EdgeWeightMode::kDevex;
  } else if (edge_weight_strategy == kSimplexEdgeWeightStrategyDantzig) {
    edge_weight_mode = EdgeWeightMode::kDantzig;
  } else {
    assert(edge_weight_strategy == kSimplexEdgeWeightStrategySteepestEdge);
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
  }
  if (edge_weight_mode == EdgeWeightMode::kDantzig) {
    edge_weight_.assign(num_tot, 1.0);
  } else if (edge_weight_mode == EdgeWeightMode::kDevex) {
    initialiseDevexFramework();
  } else if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    computePrimalSteepestEdgeWeights();
  }
}